

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O1

bool absl::lts_20250127::str_format_internal::ConvertIntArg<absl::lts_20250127::uint128>
               (uint128 v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  IntDigits *pIVar5;
  FormatSinkImpl *pFVar6;
  FormatSinkImpl *sink_00;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  string_view v_00;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  FormatConversionSpecImpl conv_02;
  IntDigits as_digits;
  undefined8 local_58;
  uint local_50;
  IntDigits local_48;
  
  sink_00 = (FormatSinkImpl *)v.hi_;
  uVar3 = v.lo_;
  local_50 = conv.precision_;
  pIVar5 = conv._0_8_;
  conv_01.precision_ = (int)sink;
  local_58 = pIVar5;
  switch(conv.conv_) {
  case c:
    local_58._2_1_ = conv.length_mod_;
    if (local_58._2_1_ != l) {
      conv_00.precision_ = conv_01.precision_;
      conv_00._0_8_ = pIVar5;
      anon_unknown_53::ConvertCharImpl
                ((char)v.lo_,conv_00,
                 (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),local_50));
      return true;
    }
    conv_01.width_ = 0;
    conv_01.conv_ = (char)local_50;
    conv_01.flags_ = (char)(local_50 >> 8);
    conv_01.length_mod_ = (char)(local_50 >> 0x10);
    conv_01._3_1_ = (char)(local_50 >> 0x18);
    bVar2 = anon_unknown_53::ConvertWCharTImpl
                      ((anon_unknown_53 *)(uVar3 & 0xffffffff),conv._0_4_,conv_01,sink_00);
    return bVar2;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = absl::uint128]"
                 );
  case d:
  case i:
  case u:
  case v:
    anon_unknown_53::IntDigits::PrintAsDec(&local_48,v,false);
    goto LAB_01065183;
  case o:
    lVar4 = 0;
    pFVar6 = sink_00;
    do {
      do {
        bVar1 = (byte)uVar3;
        uVar3 = uVar3 >> 3 | (long)pFVar6 << 0x3d;
        local_48.storage_[lVar4 + 0x2b] = bVar1 & 7 | 0x30;
        sink_00 = (FormatSinkImpl *)((ulong)pFVar6 >> 3);
        lVar4 = lVar4 + -1;
        bVar2 = (FormatSinkImpl *)&DAT_00000007 < pFVar6;
        pFVar6 = sink_00;
      } while (bVar2);
    } while (uVar3 != 0);
    break;
  case x:
    anon_unknown_53::IntDigits::PrintAsHexLower<absl::lts_20250127::uint128>(&local_48,v);
    goto LAB_01065183;
  case X:
    lVar4 = 0;
    pFVar6 = sink_00;
    do {
      do {
        uVar7 = (uint)uVar3;
        uVar3 = uVar3 >> 4 | (long)pFVar6 << 0x3c;
        local_48.storage_[lVar4 + 0x2b] = "0123456789ABCDEF"[uVar7 & 0xf];
        sink_00 = (FormatSinkImpl *)((ulong)pFVar6 >> 4);
        lVar4 = lVar4 + -1;
        bVar2 = (FormatSinkImpl *)&DAT_0000000f < pFVar6;
        pFVar6 = sink_00;
      } while (bVar2);
    } while (uVar3 != 0);
    break;
  case f:
  case F:
  case e:
  case E:
  case g:
  case G:
  case a:
  case A:
    auVar8._8_4_ = v.lo_._4_4_;
    auVar8._0_8_ = uVar3;
    auVar8._12_4_ = 0x45300000;
    auVar9._8_4_ = v.hi_._4_4_;
    auVar9._0_8_ = sink_00;
    auVar9._12_4_ = 0x45300000;
    bVar2 = ConvertFloatImpl(((auVar9._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)v.hi_) - 4503599627370496.0)) *
                             1.8446744073709552e+19 +
                             (auVar8._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)v.lo_) - 4503599627370496.0),
                             (FormatConversionSpecImpl *)&local_58,sink);
    return bVar2;
  }
  local_48.start_ = local_48.storage_ + lVar4 + 0x2c;
  local_48.size_ = -lVar4;
LAB_01065183:
  if (local_58._1_1_ == kBasic) {
    v_00._M_str = local_48.start_;
    v_00._M_len = local_48.size_;
    FormatSinkImpl::Append(sink,v_00);
  }
  else {
    conv_02.width_ = 0;
    conv_02.conv_ = (undefined1)local_50;
    conv_02.flags_ = local_50._1_1_;
    conv_02.length_mod_ = local_50._2_1_;
    conv_02._3_1_ = local_50._3_1_;
    conv_02.precision_ = conv_01.precision_;
    anon_unknown_53::ConvertIntImplInnerSlow((anon_unknown_53 *)&local_48,local_58,conv_02,sink_00);
  }
  return true;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}